

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fretInit.c
# Opt level: O1

void Abc_FlowRetime_UpdateForwardInit_rec(Abc_Obj_t *pObj)

{
  uint *puVar1;
  int iVar2;
  Abc_NtkFunc_t AVar3;
  Abc_Ntk_t *pAVar4;
  Abc_Ntk_t *pAVar5;
  DdManager *dd;
  void *pvVar6;
  void **ppvVar7;
  Flow_Data_t *pFVar8;
  Flow_Data_t FVar9;
  Flow_Data_t FVar10;
  MinRegMan_t *pMVar11;
  uint uVar12;
  int iVar13;
  anon_union_8_2_00a17ec8_for_Hop_Obj_t__0 in_RAX;
  DdNode *pDVar14;
  DdNode *f;
  char *pSop;
  ushort uVar15;
  undefined8 *puVar16;
  int *piVar17;
  ushort uVar18;
  int in_EDX;
  int Fill;
  uint uVar19;
  long lVar20;
  anon_union_8_2_00a17ec8_for_Hop_Obj_t__0 local_38;
  
  uVar12 = *(uint *)&pObj->field_0x14 & 0xf;
  if (uVar12 == 5) {
    return;
  }
  if (uVar12 == 2) {
    __assert_fail("!Abc_ObjIsPi(pObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/fret/fretInit.c"
                  ,0xbc,"void Abc_FlowRetime_UpdateForwardInit_rec(Abc_Obj_t *)");
  }
  pAVar4 = pObj->pNtk;
  iVar13 = pObj->Id;
  local_38 = in_RAX;
  Vec_IntFillExtra(&pAVar4->vTravIds,iVar13 + 1,in_EDX);
  if (((long)iVar13 < 0) || ((pAVar4->vTravIds).nSize <= iVar13)) {
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                  ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
  }
  pAVar5 = pObj->pNtk;
  iVar2 = pAVar5->nTravIds;
  if ((pAVar4->vTravIds).pArray[iVar13] == iVar2) {
    return;
  }
  iVar13 = pObj->Id;
  Vec_IntFillExtra(&pAVar5->vTravIds,iVar13 + 1,Fill);
  if (((long)iVar13 < 0) || ((pAVar5->vTravIds).nSize <= iVar13)) {
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                  ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
  }
  (pAVar5->vTravIds).pArray[iVar13] = iVar2;
  if (0 < (pObj->vFanins).nSize) {
    lVar20 = 0;
    do {
      Abc_FlowRetime_UpdateForwardInit_rec
                ((Abc_Obj_t *)pObj->pNtk->vObjs->pArray[(pObj->vFanins).pArray[lVar20]]);
      lVar20 = lVar20 + 1;
    } while (lVar20 < (pObj->vFanins).nSize);
  }
  uVar12 = *(uint *)&pObj->field_0x14 & 0xf;
  if (uVar12 == 8) {
    __assert_fail("!Abc_ObjIsLatch(pObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/fret/fretInit.c"
                  ,0x12f,"void Abc_FlowRetime_SimulateNode(Abc_Obj_t *)");
  }
  puVar16 = (undefined8 *)((ulong)pObj & 0xfffffffffffffffe);
  if (puVar16 == (undefined8 *)0x0) {
    __assert_fail("Abc_ObjRegular(pObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/fret/fretInit.c"
                  ,0x130,"void Abc_FlowRetime_SimulateNode(Abc_Obj_t *)");
  }
  pAVar4 = pObj->pNtk;
  dd = (DdManager *)pAVar4->pManFunc;
  f = (DdNode *)(pObj->field_5).pData;
  if (pAVar4->ntkType == ABC_NTK_STRASH) {
    if (*(int *)*puVar16 != 3) {
      __assert_fail("Abc_NtkIsStrash(Abc_ObjRegular(pNode)->pNtk)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abc.h"
                    ,0x18e,"int Abc_AigNodeIsConst(Abc_Obj_t *)");
    }
    if ((*(uint *)((long)puVar16 + 0x14) & 0xf) == 1) {
LAB_004d96e1:
      *(ushort *)(pManMR->pDataArray + (uint)pObj->Id) =
           *(ushort *)(pManMR->pDataArray + (uint)pObj->Id) & 0xff9f;
      *(ushort *)(pManMR->pDataArray + (uint)pObj->Id) =
           *(ushort *)(pManMR->pDataArray + (uint)pObj->Id) | 0x40;
      return;
    }
  }
  else if (uVar12 == 7) {
    iVar13 = Abc_NodeIsConst0(pObj);
    if (iVar13 != 0) {
      *(ushort *)(pManMR->pDataArray + (uint)pObj->Id) =
           *(ushort *)(pManMR->pDataArray + (uint)pObj->Id) & 0xff9f;
      *(ushort *)(pManMR->pDataArray + (uint)pObj->Id) =
           *(ushort *)(pManMR->pDataArray + (uint)pObj->Id) | 0x20;
      return;
    }
    iVar13 = Abc_NodeIsConst1(pObj);
    if (iVar13 != 0) goto LAB_004d96e1;
  }
  pMVar11 = pManMR;
  uVar12 = *(uint *)&pObj->field_0x14;
  if ((uVar12 & 0xf) != 7) {
    uVar18 = *(ushort *)
              (pManMR->pDataArray +
              *(uint *)((long)pObj->pNtk->vObjs->pArray[*(pObj->vFanins).pArray] + 0x10));
    pFVar8 = pManMR->pDataArray + (uint)pObj->Id;
    *(ushort *)pFVar8 = *(ushort *)pFVar8 & 0xff9f;
    if ((uVar18 & 0x60) == 0) {
      return;
    }
    uVar15 = *(ushort *)(pManMR->pDataArray + (uint)pObj->Id);
    if ((uVar12 >> 10 & 1) == (uint)((uVar18 >> 6 & 1) != 0)) {
      uVar15 = uVar15 | 0x20;
    }
    else {
      uVar15 = uVar15 | 0x40;
    }
    *(ushort *)(pManMR->pDataArray + (uint)pObj->Id) = uVar15;
    return;
  }
  AVar3 = pAVar4->ntkFunc;
  piVar17 = (int *)(ulong)AVar3;
  if (AVar3 == ABC_FUNC_AIG) {
    if (pAVar4->ntkType != ABC_NTK_STRASH) {
      if ((pObj->field_5).pData == (void *)0x0) {
        __assert_fail("pObj->pData",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/fret/fretInit.c"
                      ,0x172,"void Abc_FlowRetime_SimulateNode(Abc_Obj_t *)");
      }
      iVar13 = (pObj->vFanins).nSize;
      if (*(int *)&dd->acache < iVar13) {
        __assert_fail("Abc_ObjFaninNum(pObj) <= Hop_ManPiNum(pHop)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/fret/fretInit.c"
                      ,0x173,"void Abc_FlowRetime_SimulateNode(Abc_Obj_t *)");
      }
      if (0 < iVar13) {
        piVar17 = (int *)0x0;
        do {
          if ((long)*(int *)(*(long *)&dd->sentinel + 4) <= (long)piVar17) goto LAB_004d9b80;
          pvVar6 = pObj->pNtk->vObjs->pArray[(pObj->vFanins).pArray[(long)piVar17]];
          lVar20 = *(long *)(*(long *)(*(long *)&dd->sentinel + 8) + (long)piVar17 * 8);
          *(uint *)(lVar20 + 0x20) =
               *(uint *)(lVar20 + 0x20) & 0xffffffef |
               *(uint *)(pMVar11->pDataArray + *(uint *)((long)pvVar6 + 0x10)) >> 2 & 0x10;
          if ((long)*(int *)(*(long *)&dd->sentinel + 4) <= (long)piVar17) goto LAB_004d9b80;
          lVar20 = *(long *)(*(long *)(*(long *)&dd->sentinel + 8) + (long)piVar17 * 8);
          *(uint *)(lVar20 + 0x20) =
               *(uint *)(lVar20 + 0x20) & 0xffffffdf |
               (uint)((undefined1  [24])
                      ((undefined1  [24])pMVar11->pDataArray[*(uint *)((long)pvVar6 + 0x10)] &
                      (undefined1  [24])0x60) != (undefined1  [24])0x0) << 5;
          piVar17 = (int *)((long)piVar17 + 1);
        } while ((long)piVar17 < (long)(pObj->vFanins).nSize);
      }
      Abc_FlowRetime_EvalHop_rec
                ((Hop_Man_t *)(pObj->field_5).pData,(Hop_Obj_t *)&local_38,
                 (int *)((long)&local_38 + 4),piVar17);
      Abc_FlowRetime_SetInitValue(pObj,local_38.iData,local_38._4_4_);
      if ((pObj->vFanins).nSize < 1) {
        return;
      }
      lVar20 = 0;
      while (lVar20 < *(int *)(*(long *)&dd->sentinel + 4)) {
        puVar1 = (uint *)(*(long *)(*(long *)(*(long *)&dd->sentinel + 8) + lVar20 * 8) + 0x20);
        *puVar1 = *puVar1 & 0xffffffef;
        if (*(int *)(*(long *)&dd->sentinel + 4) <= lVar20) break;
        puVar1 = (uint *)(*(long *)(*(long *)(*(long *)&dd->sentinel + 8) + lVar20 * 8) + 0x20);
        *puVar1 = *puVar1 & 0xffffffdf;
        lVar20 = lVar20 + 1;
        if ((pObj->vFanins).nSize <= lVar20) {
          return;
        }
      }
LAB_004d9b80:
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                    ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
    }
  }
  else {
    if (AVar3 == ABC_FUNC_BDD) {
      if (dd == (DdManager *)0x0) {
        __assert_fail("dd",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/fret/fretInit.c"
                      ,0x155,"void Abc_FlowRetime_SimulateNode(Abc_Obj_t *)");
      }
      if (f != (DdNode *)0x0) {
        if (0 < (pObj->vFanins).nSize) {
          lVar20 = 0;
          do {
            pvVar6 = pObj->pNtk->vObjs->pArray[(pObj->vFanins).pArray[lVar20]];
            pDVar14 = Cudd_bddIthVar(dd,(int)lVar20);
            if ((undefined1  [24])
                ((undefined1  [24])pManMR->pDataArray[*(uint *)((long)pvVar6 + 0x10)] &
                (undefined1  [24])0x60) != (undefined1  [24])0x0) {
              if ((undefined1  [24])
                  ((undefined1  [24])pManMR->pDataArray[*(uint *)((long)pvVar6 + 0x10)] &
                  (undefined1  [24])0x20) != (undefined1  [24])0x0) {
                pDVar14 = (DdNode *)((ulong)pDVar14 ^ 1);
              }
              f = Cudd_Cofactor(dd,f,pDVar14);
            }
            lVar20 = lVar20 + 1;
          } while (lVar20 < (pObj->vFanins).nSize);
        }
        pDVar14 = Cudd_ReadOne(dd);
        iVar13 = *(int *)((ulong)f & 0xfffffffffffffffe);
        *(ushort *)(pManMR->pDataArray + (uint)pObj->Id) =
             *(ushort *)(pManMR->pDataArray + (uint)pObj->Id) & 0xff9f;
        if (iVar13 != 0x7fffffff) {
          return;
        }
        uVar18 = *(ushort *)(pManMR->pDataArray + (uint)pObj->Id);
        if (f == pDVar14) {
          uVar18 = uVar18 | 0x40;
        }
        else {
          uVar18 = uVar18 | 0x20;
        }
        *(ushort *)(pManMR->pDataArray + (uint)pObj->Id) = uVar18;
        return;
      }
      __assert_fail("pBdd",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/fret/fretInit.c"
                    ,0x156,"void Abc_FlowRetime_SimulateNode(Abc_Obj_t *)");
    }
    if (AVar3 == ABC_FUNC_SOP) {
      pSop = (char *)(pObj->field_5).pData;
      goto LAB_004d9a00;
    }
  }
  if (pAVar4->ntkType == ABC_NTK_STRASH) {
    piVar17 = (pObj->vFanins).pArray;
    ppvVar7 = pObj->pNtk->vObjs->pArray;
    pFVar8 = pManMR->pDataArray;
    FVar9 = pFVar8[*(uint *)((long)ppvVar7[*piVar17] + 0x10)];
    uVar19 = uVar12 >> 10 & 1 ^
             (uint)((undefined1  [24])((undefined1  [24])FVar9 & (undefined1  [24])0x20) ==
                   (undefined1  [24])0x0);
    FVar10 = pFVar8[*(uint *)((long)ppvVar7[piVar17[1]] + 0x10)];
    uVar12 = uVar12 >> 0xb & 1 ^
             (uint)((undefined1  [24])((undefined1  [24])FVar10 & (undefined1  [24])0x20) ==
                   (undefined1  [24])0x0);
    *(ushort *)(pFVar8 + (uint)pObj->Id) = *(ushort *)(pFVar8 + (uint)pObj->Id) & 0xff9f;
    if (((uVar12 & uVar19) != 0) &&
       ((undefined1  [24])((undefined1  [24])FVar9 & (undefined1  [24])0x60) ==
        (undefined1  [24])0x0 ||
        (undefined1  [24])((undefined1  [24])FVar10 & (undefined1  [24])0x60) ==
        (undefined1  [24])0x0)) {
      return;
    }
    uVar18 = *(ushort *)(pManMR->pDataArray + (uint)pObj->Id);
    if ((uVar12 & uVar19) == 0) {
      uVar18 = uVar18 | 0x20;
    }
    else {
      uVar18 = uVar18 | 0x40;
    }
    *(ushort *)(pManMR->pDataArray + (uint)pObj->Id) = uVar18;
    return;
  }
  if (AVar3 != ABC_FUNC_MAP) {
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/fret/fretInit.c"
                  ,0x1a6,"void Abc_FlowRetime_SimulateNode(Abc_Obj_t *)");
  }
  pSop = Mio_GateReadSop((Mio_Gate_t *)(pObj->field_5).pData);
LAB_004d9a00:
  Abc_FlowRetime_SimulateSop(pObj,pSop);
  return;
}

Assistant:

void Abc_FlowRetime_UpdateForwardInit_rec( Abc_Obj_t * pObj ) {
  Abc_Obj_t *pNext;
  int i;

  assert(!Abc_ObjIsPi(pObj)); // should never reach the inputs

  if (Abc_ObjIsBo(pObj)) return;

  // visited?
  if (Abc_NodeIsTravIdCurrent(pObj)) return;
  Abc_NodeSetTravIdCurrent(pObj);

  Abc_ObjForEachFanin( pObj, pNext, i ) {
    Abc_FlowRetime_UpdateForwardInit_rec( pNext );
  }
  
  Abc_FlowRetime_SimulateNode( pObj );
}